

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O3

bool __thiscall
flow_cutter::MultiCutter::
advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::PierceNodeScore>
          (MultiCutter *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph,TemporaryData *tmp,PseudoDepthFirstSearch *search_algo,
          PierceNodeScore *score_pierce_node,bool should_skip_non_maximum_sides)

{
  undefined8 *puVar1;
  int iVar2;
  void *pvVar3;
  undefined8 uVar4;
  AssimilatedNodeSet *pAVar5;
  bool bVar6;
  DistanceAwareCutter *x_1;
  long lVar7;
  pointer pDVar8;
  long lVar9;
  pointer pDVar10;
  pointer pDVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  undefined7 in_register_00000089;
  int iVar19;
  vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
  *__range3;
  anon_class_16_2_0ed2c766 my_score_pierce_node;
  type x;
  int local_153c;
  anon_class_16_2_5167d1e9 local_1538;
  MultiCutter *local_1528;
  undefined4 uStack_1520;
  undefined4 local_151c;
  TemporaryData *local_1518;
  PseudoDepthFirstSearch *local_1510;
  anon_class_16_2_0ed2c766 local_1508;
  PierceNodeScore *local_14f8;
  DistanceAwareCutter local_14f0;
  
  local_151c = (undefined4)CONCAT71(in_register_00000089,should_skip_non_maximum_sides);
  if ((graph->tail).original_node_count == this->current_smaller_side_size) {
LAB_00130d9c:
    bVar6 = false;
  }
  else {
    iVar17 = this->current_cutter_id;
    pDVar10 = (this->cutter_list).
              super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar13 = pDVar10[iVar17].cutter.reachable[0].node_set.node_count_inside_;
    if ((iVar13 == pDVar10[iVar17].cutter.assimilated[0].node_set.node_count_inside_) &&
       (iVar19 = pDVar10[iVar17].cutter.assimilated[1].node_set.node_count_inside_,
       iVar13 <= iVar19 || pDVar10[iVar17].cutter.reachable[1].node_set.node_count_inside_ != iVar19
       )) {
      iVar13 = 0;
    }
    else {
      iVar13 = 1;
    }
    uVar14 = (ulong)(*(long *)((long)&pDVar10[iVar17].cutter.assimilated[0].front.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish + (ulong)(uint)(iVar13 << 6)
                              ) -
                    *(long *)((long)&pDVar10[iVar17].cutter.assimilated[0].front.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + (ulong)(uint)(iVar13 << 6)))
             >> 2;
    pDVar11 = (this->cutter_list).
              super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_1528 = this;
    local_1518 = tmp;
    local_1510 = search_algo;
    local_14f8 = score_pierce_node;
    do {
      local_153c = 0;
      uVar15 = (int)((ulong)((long)pDVar11 - (long)pDVar10) >> 6) * 0x2b2e43db;
      if (0 < (int)uVar15) {
        do {
          lVar7 = (long)local_153c;
          lVar9 = 0;
          do {
            *(undefined4 *)
             ((long)&local_14f0.cutter.assimilated[0].node_set.node_count_inside_ + lVar9) =
                 *(undefined4 *)
                  ((long)&pDVar10[lVar7].cutter.assimilated[0].node_set.node_count_inside_ + lVar9);
            *(undefined4 *)
             ((long)&local_14f0.cutter.assimilated[0].node_set.inside_flag.preimage_ + lVar9) =
                 *(undefined4 *)
                  ((long)&pDVar10[lVar7].cutter.assimilated[0].node_set.inside_flag.preimage_ +
                  lVar9);
            *(undefined4 *)
             ((long)&local_14f0.cutter.assimilated[0].node_set.inside_flag.data_ + lVar9) =
                 *(undefined4 *)
                  ((long)&pDVar10[lVar7].cutter.assimilated[0].node_set.inside_flag.data_.
                          preimage_count_ + lVar9);
            *(undefined8 *)
             ((long)&local_14f0.cutter.assimilated[0].node_set.inside_flag.data_ + lVar9 + 8U) =
                 *(undefined8 *)
                  ((long)&pDVar10[lVar7].cutter.assimilated[0].node_set.inside_flag.data_.data_ +
                  lVar9);
            *(undefined4 *)
             ((long)&pDVar10[lVar7].cutter.assimilated[0].node_set.inside_flag.data_.preimage_count_
             + lVar9) = 0;
            *(undefined8 *)
             ((long)&pDVar10[lVar7].cutter.assimilated[0].node_set.inside_flag.data_.data_ + lVar9)
                 = 0;
            *(undefined4 *)((long)&local_14f0.cutter.assimilated[0].node_set.extra_node + lVar9) =
                 *(undefined4 *)
                  ((long)&pDVar10[lVar7].cutter.assimilated[0].node_set.extra_node + lVar9);
            puVar1 = (undefined8 *)
                     ((long)&pDVar10[lVar7].cutter.assimilated[0].front.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar9);
            uVar4 = puVar1[1];
            *(undefined8 *)
             ((long)&local_14f0.cutter.assimilated[0].front.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar9) = *puVar1;
            *(undefined8 *)
             ((long)&local_14f0.cutter.assimilated[0].front.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar9 + 8) = uVar4;
            *(undefined8 *)
             ((long)&local_14f0.cutter.assimilated[0].front.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar9 + 0x10) =
                 *(undefined8 *)
                  ((long)&pDVar10[lVar7].cutter.assimilated[0].front.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + lVar9);
            *(undefined8 *)
             ((long)&pDVar10[lVar7].cutter.assimilated[0].front.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_end_of_storage + lVar9) = 0;
            puVar1 = (undefined8 *)
                     ((long)&pDVar10[lVar7].cutter.assimilated[0].front.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar9);
            *puVar1 = 0;
            puVar1[1] = 0;
            lVar9 = lVar9 + 0x40;
          } while (lVar9 != 0x80);
          lVar9 = 0xb0;
          do {
            *(undefined4 *)((long)&uStack_1520 + lVar9) =
                 *(undefined4 *)((long)pDVar10[lVar7].cutter.assimilated + lVar9 + -0x30);
            *(undefined4 *)((long)&local_1518 + lVar9) =
                 *(undefined4 *)((long)pDVar10[lVar7].cutter.assimilated + lVar9 + -0x28);
            *(undefined4 *)((long)&local_1510 + lVar9) =
                 *(undefined4 *)((long)pDVar10[lVar7].cutter.assimilated + lVar9 + -0x20);
            *(undefined8 *)((long)&local_1508.score_pierce_node + lVar9) =
                 *(undefined8 *)((long)pDVar10[lVar7].cutter.assimilated + lVar9 + -0x18);
            *(undefined4 *)((long)pDVar10[lVar7].cutter.assimilated + lVar9 + -0x20) = 0;
            *(undefined8 *)((long)pDVar10[lVar7].cutter.assimilated + lVar9 + -0x18) = 0;
            *(undefined4 *)((long)&local_1508.i + lVar9) =
                 *(undefined4 *)((long)pDVar10[lVar7].cutter.assimilated + lVar9 + -0x10);
            *(undefined4 *)((long)local_14f0.cutter.assimilated + lVar9 + -8) =
                 *(undefined4 *)((long)pDVar10[lVar7].cutter.assimilated + lVar9 + -8);
            *(undefined8 *)
             ((long)&local_14f0.cutter.assimilated[0].node_set.node_count_inside_ + lVar9) =
                 *(undefined8 *)
                  ((long)&pDVar10[lVar7].cutter.assimilated[0].node_set.node_count_inside_ + lVar9);
            *(undefined4 *)((long)pDVar10[lVar7].cutter.assimilated + lVar9 + -8) = 0;
            *(undefined8 *)
             ((long)&pDVar10[lVar7].cutter.assimilated[0].node_set.node_count_inside_ + lVar9) = 0;
            lVar9 = lVar9 + 0x38;
          } while (lVar9 != 0x120);
          local_14f0.cutter.flow.flow.preimage_ = pDVar10[lVar7].cutter.flow.flow.preimage_;
          local_14f0.cutter.flow.flow.data_.preimage_count_ =
               pDVar10[lVar7].cutter.flow.flow.data_.preimage_count_;
          local_14f0.cutter.flow.flow.data_.data_ = pDVar10[lVar7].cutter.flow.flow.data_.data_;
          pDVar10[lVar7].cutter.flow.flow.data_.preimage_count_ = 0;
          pDVar10[lVar7].cutter.flow.flow.data_.data_ = (unsigned_long *)0x0;
          local_14f0.cutter.flow_intensity = pDVar10[lVar7].cutter.flow_intensity;
          pDVar11 = pDVar10 + lVar7;
          local_14f0.cutter.cut_available = (pDVar11->cutter).cut_available;
          local_14f0.cutter._265_3_ = *(undefined3 *)&(pDVar11->cutter).field_0x109;
          local_14f0.cutter.max_flow_intensity = (pDVar11->cutter).max_flow_intensity;
          lVar9 = 0x120;
          do {
            *(undefined4 *)((long)local_14f0.cutter.assimilated + lVar9 + -8) =
                 *(undefined4 *)((long)pDVar10[lVar7].cutter.assimilated + lVar9 + -8);
            *(undefined8 *)
             ((long)&local_14f0.cutter.assimilated[0].node_set.node_count_inside_ + lVar9) =
                 *(undefined8 *)
                  ((long)&pDVar10[lVar7].cutter.assimilated[0].node_set.node_count_inside_ + lVar9);
            *(undefined4 *)((long)pDVar10[lVar7].cutter.assimilated + lVar9 + -8) = 0;
            *(undefined8 *)
             ((long)&pDVar10[lVar7].cutter.assimilated[0].node_set.node_count_inside_ + lVar9) = 0;
            lVar9 = lVar9 + 0x10;
          } while (lVar9 != 0x140);
          memcpy(&local_14f0.rng,&pDVar10[lVar7].rng,5000);
          local_1508.score_pierce_node = local_14f8;
          local_1508.i = &local_153c;
          if (local_14f0.cutter.cut_available == true) {
            if ((local_14f0.cutter.reachable[0].node_set.node_count_inside_ !=
                 local_14f0.cutter.assimilated[0].node_set.node_count_inside_) ||
               (pAVar5 = local_14f0.cutter.assimilated,
               local_14f0.cutter.assimilated[1].node_set.node_count_inside_ <
               local_14f0.cutter.reachable[0].node_set.node_count_inside_ &&
               local_14f0.cutter.reachable[1].node_set.node_count_inside_ ==
               local_14f0.cutter.assimilated[1].node_set.node_count_inside_)) {
              pAVar5 = local_14f0.cutter.assimilated + 1;
            }
            if (((int)uVar14 ==
                 (int)((ulong)((long)(pAVar5->front).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(pAVar5->front).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2)) &&
               (local_1538.score_pierce_node = &local_1508, local_1538.this = &local_14f0,
               bVar6 = BasicCutter::
                       advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>,_flow_cutter::PseudoDepthFirstSearch,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ben_strasser[P]flow_cutter_pace20_src_flow_cutter_h:810:37)>
                                 (&local_14f0.cutter,graph,local_1518,local_1510,&local_1538), bVar6
               )) {
              do {
                local_1538.score_pierce_node = &local_1508;
                local_1538.this = &local_14f0;
                bVar6 = BasicCutter::
                        does_next_advance_increase_cut<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ben_strasser[P]flow_cutter_pace20_src_flow_cutter_h:825:37)>
                                  (&local_14f0.cutter,graph,(anon_class_16_2_5167d1e9 *)&local_1538)
                ;
                if (bVar6) break;
                local_1538.score_pierce_node = &local_1508;
                local_1538.this = &local_14f0;
                bVar6 = BasicCutter::
                        advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>,_flow_cutter::PseudoDepthFirstSearch,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ben_strasser[P]flow_cutter_pace20_src_flow_cutter_h:810:37)>
                                  (&local_14f0.cutter,graph,local_1518,local_1510,&local_1538);
              } while (((byte)local_151c & bVar6) != 0);
            }
          }
          pDVar10 = (this->cutter_list).
                    super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                    ._M_impl.super__Vector_impl_data._M_start + local_153c;
          BasicCutter::operator=(&pDVar10->cutter,&local_14f0.cutter);
          lVar7 = 0x118;
          do {
            ArrayIDFunc<int>::operator=
                      ((ArrayIDFunc<int> *)
                       ((long)&(pDVar10->cutter).assimilated[0].node_set.node_count_inside_ + lVar7)
                       ,(ArrayIDFunc<int> *)
                        ((long)&local_14f0.cutter.assimilated[0].node_set.node_count_inside_ + lVar7
                        ));
            lVar7 = lVar7 + 0x10;
          } while (lVar7 != 0x138);
          memcpy(&pDVar10->rng,&local_14f0.rng,5000);
          this = local_1528;
          lVar7 = 0x130;
          do {
            pvVar3 = *(void **)((long)&local_14f0.cutter.assimilated[0].node_set.node_count_inside_
                               + lVar7);
            if (pvVar3 != (void *)0x0) {
              operator_delete__(pvVar3);
            }
            lVar7 = lVar7 + -0x10;
          } while (lVar7 != 0x110);
          if (local_14f0.cutter.flow.flow.data_.data_ != (unsigned_long *)0x0) {
            operator_delete__(local_14f0.cutter.flow.flow.data_.data_);
          }
          lVar7 = 0xd0;
          do {
            pvVar3 = *(void **)((long)&local_14f0.cutter.assimilated[0].node_set.inside_flag.data_ +
                               lVar7 + 8U);
            if (pvVar3 != (void *)0x0) {
              operator_delete__(pvVar3);
            }
            pvVar3 = *(void **)((long)&local_14f0.cutter.assimilated[0].node_set.node_count_inside_
                               + lVar7);
            if (pvVar3 != (void *)0x0) {
              operator_delete__(pvVar3);
            }
            lVar7 = lVar7 + -0x38;
          } while (lVar7 != 0x60);
          lVar7 = 0x58;
          do {
            pvVar3 = *(void **)((long)&local_14f0.cutter.assimilated[0].node_set.inside_flag.data_ +
                               lVar7);
            if (pvVar3 != (void *)0x0) {
              operator_delete(pvVar3);
            }
            pvVar3 = *(void **)((long)&local_14f0.cutter.assimilated[0].node_set.node_count_inside_
                               + lVar7);
            if (pvVar3 != (void *)0x0) {
              operator_delete__(pvVar3);
            }
            lVar7 = lVar7 + -0x40;
          } while (lVar7 != -0x28);
          local_153c = local_153c + 1;
          pDVar10 = (this->cutter_list).
                    super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pDVar11 = (this->cutter_list).
                    super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          uVar15 = (int)((ulong)((long)pDVar11 - (long)pDVar10) >> 6) * 0x2b2e43db;
        } while (local_153c < (int)uVar15);
      }
      if (pDVar10 == pDVar11) goto LAB_00130d9c;
      pDVar8 = pDVar10;
      uVar16 = 0x7fffffff;
      do {
        uVar14 = uVar16;
        if ((pDVar8->cutter).cut_available == true) {
          iVar17 = (pDVar8->cutter).reachable[0].node_set.node_count_inside_;
          if ((iVar17 == (pDVar8->cutter).assimilated[0].node_set.node_count_inside_) &&
             (iVar13 = (pDVar8->cutter).assimilated[1].node_set.node_count_inside_,
             iVar17 <= iVar13 || (pDVar8->cutter).reachable[1].node_set.node_count_inside_ != iVar13
             )) {
            iVar17 = 0;
          }
          else {
            iVar17 = 1;
          }
          uVar18 = (ulong)(*(long *)((long)&(pDVar8->cutter).assimilated[0].front.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish +
                                    (ulong)(uint)(iVar17 << 6)) -
                          *(long *)((long)&(pDVar8->cutter).assimilated[0].front.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start +
                                   (ulong)(uint)(iVar17 << 6))) >> 2;
          uVar14 = uVar18 & 0xffffffff;
          if ((int)uVar16 < (int)uVar18) {
            uVar14 = uVar16;
          }
        }
        pDVar8 = pDVar8 + 1;
        uVar16 = uVar14;
      } while (pDVar8 != pDVar11);
      iVar17 = 0;
      iVar13 = (int)uVar14;
      if (iVar13 == 0x7fffffff) {
        return false;
      }
      if ((int)uVar15 < 1) {
        iVar19 = -1;
      }
      else {
        uVar18 = 0;
        uVar16 = 0xffffffff;
        iVar17 = 0;
        pDVar8 = pDVar10;
        do {
          if ((pDVar8->cutter).cut_available == true) {
            iVar19 = (pDVar8->cutter).reachable[0].node_set.node_count_inside_;
            if (iVar19 == (pDVar8->cutter).assimilated[0].node_set.node_count_inside_) {
              iVar12 = (pDVar8->cutter).assimilated[1].node_set.node_count_inside_;
              iVar2 = (pDVar8->cutter).reachable[1].node_set.node_count_inside_;
              if (iVar12 < iVar19 && iVar2 == iVar12) {
                iVar12 = (int)((ulong)((long)(pDVar8->cutter).assimilated[1].front.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_finish -
                                      (long)(pDVar8->cutter).assimilated[1].front.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start) >> 2);
                iVar19 = iVar2;
              }
              else {
                iVar12 = (int)((ulong)((long)(pDVar8->cutter).assimilated[0].front.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_finish -
                                      (long)(pDVar8->cutter).assimilated[0].front.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start) >> 2);
              }
              this = local_1528;
              if (iVar13 == iVar12) {
LAB_001312e5:
                if (iVar17 < iVar19) {
                  uVar16 = uVar18 & 0xffffffff;
                  iVar17 = iVar19;
                }
              }
            }
            else if (iVar13 == (int)((ulong)((long)(pDVar8->cutter).assimilated[1].front.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                            (long)(pDVar8->cutter).assimilated[1].front.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2)) {
              iVar19 = (pDVar8->cutter).assimilated[1].node_set.node_count_inside_;
              goto LAB_001312e5;
            }
          }
          iVar19 = (int)uVar16;
          uVar18 = uVar18 + 1;
          pDVar8 = pDVar8 + 1;
        } while (uVar15 != uVar18);
      }
    } while (iVar17 <= this->current_smaller_side_size);
    this->current_cutter_id = iVar19;
    iVar17 = pDVar10[iVar19].cutter.reachable[0].node_set.node_count_inside_;
    if (iVar17 == pDVar10[iVar19].cutter.assimilated[0].node_set.node_count_inside_) {
      iVar12 = pDVar10[iVar19].cutter.assimilated[1].node_set.node_count_inside_;
      iVar19 = pDVar10[iVar19].cutter.reachable[1].node_set.node_count_inside_;
      iVar13 = iVar17;
      if (iVar12 < iVar17) {
        iVar13 = iVar19;
      }
      if (iVar19 != iVar12) {
        iVar13 = iVar17;
      }
    }
    else {
      iVar13 = pDVar10[iVar19].cutter.assimilated[1].node_set.node_count_inside_;
    }
    this->current_smaller_side_size = iVar13;
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool advance(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo,
        const ScorePierceNode& score_pierce_node,
        bool should_skip_non_maximum_sides = true)
    {
        if (graph.node_count() / 2 == get_current_smaller_cut_side_size())
            return false;

        int current_cut_size = cutter_list[current_cutter_id].get_current_cut().size();
        for (;;) {
            for (int i = 0; i < (int)cutter_list.size(); ++i) {
                auto x = std::move(cutter_list[i]);
                auto my_score_pierce_node = [&](int x, int side,
                                                bool causes_augmenting_path,
                                                int source_dist, int target_dist) {
                    return score_pierce_node(x, side, causes_augmenting_path, source_dist,
                        target_dist, i);
                };
                if (x.is_cut_available()) {
                    if ((int)x.get_current_cut().size() == current_cut_size) {
                        assert(
                            x.does_next_advance_increase_cut(graph, my_score_pierce_node));
                        if (x.advance(graph, tmp, search_algo, my_score_pierce_node)) {
                            assert((int)x.get_current_cut().size() > current_cut_size);
                            while (!x.does_next_advance_increase_cut(graph,
                                my_score_pierce_node)) {
                                if (!x.advance(graph, tmp, search_algo, my_score_pierce_node))
                                    break;
                                if (!should_skip_non_maximum_sides)
                                    break;
                            }
                        }
                    }
                }

                cutter_list[i] = std::move(x);
            }

            int next_cut_size = std::numeric_limits<int>::max();
            for (auto& x : cutter_list)
                if (x.is_cut_available())
                    min_to(next_cut_size, (int)x.get_current_cut().size());

            if (next_cut_size == std::numeric_limits<int>::max())
                return false;

            int best_cutter_weight = 0;
            int best_cutter_id = -1;
            for (int i = 0; i < (int)cutter_list.size(); ++i) {
                if (cutter_list[i].is_cut_available()) {
                    if ((int)cutter_list[i].get_current_cut().size() == next_cut_size && cutter_list[i].get_current_smaller_cut_side_size() > best_cutter_weight) {
                        best_cutter_id = i;
                        best_cutter_weight = cutter_list[i].get_current_smaller_cut_side_size();
                    }
                }
            }

            assert(best_cutter_id != -1);

            current_cut_size = next_cut_size;

            if (best_cutter_weight <= current_smaller_side_size)
                continue;

            current_cutter_id = best_cutter_id;
            current_smaller_side_size = cutter_list[current_cutter_id].get_current_smaller_cut_side_size();
            return true;
        }
    }